

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

handle pybind11::detail::tuple_caster<std::tuple,double,double>::
       cast_impl<std::tuple<double,double>,0ul,1ul>(undefined8 *src)

{
  undefined8 uVar1;
  handle hVar2;
  array<pybind11::object,_2UL> *__range3;
  long lVar3;
  array<pybind11::object,_2UL> entries;
  tuple result;
  object local_28;
  long local_20;
  handle local_18;
  
  hVar2.m_ptr = (PyObject *)PyFloat_FromDouble(src[1]);
  local_28.super_handle.m_ptr = (handle)(handle)hVar2.m_ptr;
  local_20 = PyFloat_FromDouble(*src);
  if (local_20 == 0 || hVar2.m_ptr == (PyObject *)0x0) {
    hVar2.m_ptr = (PyObject *)0x0;
  }
  else {
    tuple::tuple((tuple *)&local_18,2);
    hVar2.m_ptr = local_18.m_ptr;
    lVar3 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&local_28.super_handle.m_ptr + lVar3);
      *(undefined8 *)((long)&local_28.super_handle.m_ptr + lVar3) = 0;
      if (((local_18.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
        __assert_fail("PyTuple_Check(result.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/cast.h"
                      ,0x588,
                      "static handle pybind11::detail::tuple_caster<std::tuple, double, double>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <double, double>, T = std::tuple<double, double>, Is = <0UL, 1UL>]"
                     );
      }
      *(undefined8 *)((long)&local_18.m_ptr[1].ob_type + lVar3) = uVar1;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x10);
    local_18.m_ptr = (PyObject *)0x0;
    object::~object((object *)&local_18);
  }
  lVar3 = 8;
  do {
    object::~object((object *)((long)&local_28.super_handle.m_ptr + lVar3));
    lVar3 = lVar3 + -8;
  } while (lVar3 != -8);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }